

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void __thiscall hwnet::TCPSocket::SendAndClose(TCPSocket *this,Ptr *buff,size_t len)

{
  element_type *peVar1;
  Poller *this_00;
  int iVar2;
  Ptr local_58;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  char local_31 [8];
  bool post;
  
  peVar1 = (buff->super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1 != (element_type *)0x0) &&
     ((len != 0 || (len = peVar1->len, (void *)len != (void *)0x0)))) {
    local_31[0] = '\0';
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    _send(this,(int)buff,(void *)len,1,(int)local_31);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    if (local_31[0] == '\x01') {
      this_00 = this->poller_;
      std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPSocket,void>
                ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                 (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<hwnet::TCPSocket>);
      local_58.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
      local_58.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Stack_40;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Poller::PostTask(this_00,&local_58,this->pool_);
      if (local_58.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
    }
  }
  return;
}

Assistant:

void TCPSocket::SendAndClose(const Buffer::Ptr &buff,size_t len) {
	if(buff == nullptr) {
		return;
	}

	if(len == 0) {
		len = buff->Len();
	}

	if(len == 0) {
		return;
	}

	auto post = false;
	

	this->mtx.lock();
	_send(buff,len,true,post);
	this->mtx.unlock();		
	
	
	if(post) {
		poller_->PostTask(shared_from_this(),this->pool_);
	}
}